

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4495f9::ECCurveTest_AddingEqualPoints_Test::TestBody
          (ECCurveTest_AddingEqualPoints_Test *this)

{
  UniquePtr<EC_POINT> UVar1;
  int iVar2;
  ParamType_conflict *pPVar3;
  EC_POINT *pEVar4;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *message;
  char *in_R9;
  AssertHelper local_80;
  UniquePtr<EC_POINT> double_p1;
  UniquePtr<EC_POINT> p2;
  UniquePtr<BN_CTX> ctx;
  UniquePtr<EC_POINT> p1_plus_p2;
  AssertionResult gtest_ar_;
  UniquePtr<EC_POINT> p1;
  AssertionResult gtest_ar;
  AssertHelper local_20;
  UniquePtr<EC_KEY> key;
  
  pPVar3 = testing::WithParamInterface<int>::GetParam();
  key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)
       EC_KEY_new_by_curve_name(*pPVar3);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<ec_key_st_*,_bssl::internal::Deleter>)
       key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ec_key_st_*,_false>)0x0;
  if ((tuple<ec_key_st_*,_bssl::internal::Deleter>)
      key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ec_key_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&p1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x55f7b2,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&p2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x2a3,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&p2,(Message *)&p1);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar2 = EC_KEY_generate_key((EC_KEY *)
                                key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar2 != 0;
    if (iVar2 != 0) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      p1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ec_point_st,_bssl::internal::Deleter,_true,_true>)
           EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ =
           (tuple<ec_point_st_*,_bssl::internal::Deleter>)
           p1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
           (_Head_base<0UL,_ec_point_st_*,_false>)0x0;
      if ((tuple<ec_point_st_*,_bssl::internal::Deleter>)
          p1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_ec_point_st_*,_false>)0x0) {
        testing::Message::Message((Message *)&p2);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x4c14ba,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&double_p1,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x2a7,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&double_p1,(Message *)&p2);
LAB_0029e6b1:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&double_p1);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if ((__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)
            p2._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)0x0) {
          (**(code **)(*(long *)p2._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        UVar1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl =
             p1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl;
        pEVar4 = EC_KEY_get0_public_key
                           ((EC_KEY *)
                            key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
        iVar2 = EC_POINT_copy((EC_POINT *)
                              UVar1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>
                              ._M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,pEVar4);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar2 != 0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&p2);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)"EC_POINT_copy(p1.get(), EC_KEY_get0_public_key(key.get()))"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&double_p1,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x2a8,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=((AssertHelper *)&double_p1,(Message *)&p2);
          goto LAB_0029e6b1;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        p2._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<ec_point_st,_bssl::internal::Deleter,_true,_true>)
             EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             (tuple<ec_point_st_*,_bssl::internal::Deleter>)
             p2._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
             (_Head_base<0UL,_ec_point_st_*,_false>)0x0;
        if ((tuple<ec_point_st_*,_bssl::internal::Deleter>)
            p2._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl ==
            (_Head_base<0UL,_ec_point_st_*,_false>)0x0) {
          testing::Message::Message((Message *)&double_p1);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x4c1501,"false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&ctx,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x2ab,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=((AssertHelper *)&ctx,(Message *)&double_p1);
LAB_0029e79a:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ctx);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if ((__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)
              double_p1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)double_p1._M_t.
                                  super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          UVar1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl =
               p2._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl;
          pEVar4 = EC_KEY_get0_public_key
                             ((EC_KEY *)
                              key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
          iVar2 = EC_POINT_copy((EC_POINT *)
                                UVar1._M_t.
                                super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,pEVar4);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ = iVar2 != 0;
          if (iVar2 == 0) {
            testing::Message::Message((Message *)&double_p1);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar_,
                       (AssertionResult *)
                       "EC_POINT_copy(p2.get(), EC_KEY_get0_public_key(key.get()))","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&ctx,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x2ac,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=((AssertHelper *)&ctx,(Message *)&double_p1);
            goto LAB_0029e79a;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          double_p1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<ec_point_st,_bssl::internal::Deleter,_true,_true>)
               EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ =
               (tuple<ec_point_st_*,_bssl::internal::Deleter>)
               double_p1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
               (_Head_base<0UL,_ec_point_st_*,_false>)0x0;
          if ((tuple<ec_point_st_*,_bssl::internal::Deleter>)
              double_p1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl ==
              (_Head_base<0UL,_ec_point_st_*,_false>)0x0) {
            testing::Message::Message((Message *)&ctx);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"double_p1",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1_plus_p2,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x2af,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1_plus_p2,(Message *)&ctx);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p1_plus_p2);
            std::__cxx11::string::~string((string *)&gtest_ar);
            if ((__uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>)
                ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>)0x0) {
              (**(code **)(*(long *)ctx._M_t.
                                    super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl + 8))();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl =
                 (__uniq_ptr_data<bignum_ctx,_bssl::internal::Deleter,_true,_true>)BN_CTX_new();
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ =
                 (tuple<bignum_ctx_*,_bssl::internal::Deleter>)
                 ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl !=
                 (_Head_base<0UL,_bignum_ctx_*,_false>)0x0;
            if ((tuple<bignum_ctx_*,_bssl::internal::Deleter>)
                ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl ==
                (_Head_base<0UL,_bignum_ctx_*,_false>)0x0) {
              testing::Message::Message((Message *)&p1_plus_p2);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x49a3a2,
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_80,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x2b1,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
              testing::internal::AssertHelper::operator=(&local_80,(Message *)&p1_plus_p2);
LAB_0029e90f:
              testing::internal::AssertHelper::~AssertHelper(&local_80);
              std::__cxx11::string::~string((string *)&gtest_ar);
              if ((__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)
                  p1_plus_p2._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)0x0) {
                (**(code **)(*(long *)p1_plus_p2._M_t.
                                      super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 8)
                )();
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              iVar2 = EC_POINT_dbl((EC_GROUP *)(this->super_ECCurveTest).group_,
                                   (EC_POINT *)
                                   double_p1._M_t.
                                   super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                   (EC_POINT *)
                                   p1._M_t.
                                   super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                   (BN_CTX *)
                                   ctx._M_t.
                                   super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar_.success_ = iVar2 != 0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&p1_plus_p2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar_,
                           (AssertionResult *)
                           "EC_POINT_dbl(group(), double_p1.get(), p1.get(), ctx.get())","false",
                           "true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_80,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x2b2,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                testing::internal::AssertHelper::operator=(&local_80,(Message *)&p1_plus_p2);
                goto LAB_0029e90f;
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              p1_plus_p2._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl =
                   (__uniq_ptr_data<ec_point_st,_bssl::internal::Deleter,_true,_true>)
                   EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar_.success_ =
                   (tuple<ec_point_st_*,_bssl::internal::Deleter>)
                   p1_plus_p2._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
                   (_Head_base<0UL,_ec_point_st_*,_false>)0x0;
              if ((tuple<ec_point_st_*,_bssl::internal::Deleter>)
                  p1_plus_p2._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl ==
                  (_Head_base<0UL,_ec_point_st_*,_false>)0x0) {
                testing::Message::Message((Message *)&local_80);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar_,
                           (AssertionResult *)"p1_plus_p2","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_20,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x2b5,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_80);
LAB_0029e9f8:
                this_00 = &gtest_ar_.message_;
                testing::internal::AssertHelper::~AssertHelper(&local_20);
                std::__cxx11::string::~string((string *)&gtest_ar);
                if ((long *)CONCAT44(local_80.data_._4_4_,(int)local_80.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_80.data_._4_4_,(int)local_80.data_) + 8))();
                }
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                iVar2 = EC_POINT_add((EC_GROUP *)(this->super_ECCurveTest).group_,
                                     (EC_POINT *)
                                     p1_plus_p2._M_t.
                                     super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                     (EC_POINT *)
                                     p1._M_t.
                                     super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                     (EC_POINT *)
                                     p2._M_t.
                                     super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                     (BN_CTX *)
                                     ctx._M_t.
                                     super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t
                                     .super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar_.success_ = iVar2 != 0;
                if (iVar2 == 0) {
                  testing::Message::Message((Message *)&local_80);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar,(internal *)&gtest_ar_,
                             (AssertionResult *)
                             "EC_POINT_add(group(), p1_plus_p2.get(), p1.get(), p2.get(), ctx.get())"
                             ,"false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_20,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x2b7,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                  testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_80);
                  goto LAB_0029e9f8;
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                gtest_ar_.success_ = false;
                gtest_ar_._1_3_ = 0;
                local_80.data_._0_4_ =
                     EC_POINT_cmp((EC_GROUP *)(this->super_ECCurveTest).group_,
                                  (EC_POINT *)
                                  double_p1._M_t.
                                  super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                  (EC_POINT *)
                                  p1_plus_p2._M_t.
                                  super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                  (BN_CTX *)
                                  ctx._M_t.
                                  super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"0",
                           "EC_POINT_cmp(group(), double_p1.get(), p1_plus_p2.get(), ctx.get())",
                           (int *)&gtest_ar_,(int *)&local_80);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar_);
                  std::operator<<((ostream *)(CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 0x10),
                                  "A+A != 2A");
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl ==
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    message = "";
                  }
                  else {
                    message = *(char **)gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_80,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x2ba,message);
                  testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
                  testing::internal::AssertHelper::~AssertHelper(&local_80);
                  if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
                  }
                }
                this_00 = &gtest_ar.message_;
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(this_00);
              std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr(&p1_plus_p2);
            }
            std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::~unique_ptr(&ctx);
          }
          std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr(&double_p1);
        }
        std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr(&p2);
      }
      std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr(&p1);
      goto LAB_0029eaa6;
    }
    testing::Message::Message((Message *)&p1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"EC_KEY_generate_key(key.get())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&p2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x2a4,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&p2,(Message *)&p1);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p2);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if ((__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)
      p1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)0x0) {
    (**(code **)(*(long *)p1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
LAB_0029eaa6:
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr(&key);
  return;
}

Assistant:

TEST_P(ECCurveTest, AddingEqualPoints) {
  bssl::UniquePtr<EC_KEY> key(EC_KEY_new_by_curve_name(GetParam()));
  ASSERT_TRUE(key);
  ASSERT_TRUE(EC_KEY_generate_key(key.get()));

  bssl::UniquePtr<EC_POINT> p1(EC_POINT_new(group()));
  ASSERT_TRUE(p1);
  ASSERT_TRUE(EC_POINT_copy(p1.get(), EC_KEY_get0_public_key(key.get())));

  bssl::UniquePtr<EC_POINT> p2(EC_POINT_new(group()));
  ASSERT_TRUE(p2);
  ASSERT_TRUE(EC_POINT_copy(p2.get(), EC_KEY_get0_public_key(key.get())));

  bssl::UniquePtr<EC_POINT> double_p1(EC_POINT_new(group()));
  ASSERT_TRUE(double_p1);
  bssl::UniquePtr<BN_CTX> ctx(BN_CTX_new());
  ASSERT_TRUE(ctx);
  ASSERT_TRUE(EC_POINT_dbl(group(), double_p1.get(), p1.get(), ctx.get()));

  bssl::UniquePtr<EC_POINT> p1_plus_p2(EC_POINT_new(group()));
  ASSERT_TRUE(p1_plus_p2);
  ASSERT_TRUE(
      EC_POINT_add(group(), p1_plus_p2.get(), p1.get(), p2.get(), ctx.get()));

  EXPECT_EQ(0,
            EC_POINT_cmp(group(), double_p1.get(), p1_plus_p2.get(), ctx.get()))
      << "A+A != 2A";
}